

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexycal.cpp
# Opt level: O2

void get_next_char(void)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  
  if (lexemeLength == lexemeBufferSize) {
    lexemeBufferSize = (int)((long)lexemeLength + 0x20U);
    lexemeBuffer = (char *)realloc(lexemeBuffer,(long)lexemeLength + 0x20U);
  }
  if (get_next_char::n == 0) {
    pcVar2 = fgets(get_next_char::buf,0x1000,(FILE *)filePointer);
    if (pcVar2 == (char *)0x0) {
      get_next_char::n = 0;
    }
    else {
      sVar3 = strlen(get_next_char::buf);
      get_next_char::n = (int)sVar3;
    }
    get_next_char::bufp = get_next_char::buf;
  }
  if (get_next_char::n < 1) {
    cVar1 = -1;
  }
  else {
    cVar1 = *get_next_char::bufp;
    get_next_char::bufp = get_next_char::bufp + 1;
  }
  currentInput = (int)cVar1;
  lVar4 = (long)lexemeLength;
  lexemeLength = lexemeLength + 1;
  get_next_char::n = get_next_char::n + -1;
  lexemeBuffer[lVar4] = cVar1;
  currentColumn = currentColumn + 1;
  return;
}

Assistant:

void get_next_char() {
    if (lexemeLength == lexemeBufferSize) {
        lexemeBufferSize += BUFFER_SIZE;
        lexemeBuffer = (char *) realloc(lexemeBuffer, lexemeBufferSize);
    }

    static char buf[IO_BUFFER_SIZE];
    static char *bufp = buf;
    static int n = 0;
    /* Buffer is empty */
    if (n == 0) {
        n = fgets(buf, IO_BUFFER_SIZE, filePointer) != nullptr ? strlen(buf) : 0;
        bufp = buf;
    }

    char next_input = (--n >= 0) ? *bufp++ : EOF;

    lexemeBuffer[lexemeLength++] = (currentInput = next_input);
    currentColumn++;
}